

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O1

ConsCell * find_pair_in_page(conspage *pg,LispPTR cdrval)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ConsCell *pCVar12;
  
  uVar1 = *(uint *)&pg->field_0x8;
  if (uVar1 < 0x2000000) {
    return (ConsCell *)0x0;
  }
  uVar4 = uVar1 >> 0x10 & 0xff;
  if (uVar4 == 0) {
    return (ConsCell *)0x0;
  }
  uVar3 = 0;
  uVar9 = 0;
  do {
    uVar5 = uVar4;
    if (uVar9 != 0) {
      if (uVar9 <= uVar5 + 0xe && uVar5 < uVar9) {
        uVar4 = 0;
        uVar2 = uVar5;
        break;
      }
      if (uVar5 <= uVar9 + 0xe && uVar9 < uVar5) {
        pCVar12 = (ConsCell *)((long)&pg->cell6 + (ulong)uVar9 * 2);
        uVar10 = (ulong)uVar5;
        uVar4 = *(uint *)((long)&pg->cell6 + uVar10 * 2);
        if ((int)uVar3 == 0) {
          *(uint *)&pg->field_0x8 = uVar1 & 0xff00ffff | uVar4 >> 8 & 0xff0000;
        }
        else {
          *(char *)((long)&pg->cell6 + uVar3 * 2 + 3) = (char)(uVar4 >> 0x18);
        }
        lVar6 = (long)(uVar10 * 2 + (ulong)uVar9 * -2) >> 2;
        *pCVar12 = (ConsCell)((uint)*pCVar12 & 0xfffffff | (int)lVar6 << 0x1c);
        if (7 < lVar6) {
          error("in find_pair_in_page, cdr code too big.");
        }
        uVar4 = uVar9 + ((uint)*pCVar12 >> 0x1c) * 2;
        goto LAB_00114dc6;
      }
    }
    uVar2 = *(uint *)((long)&pg->cell6 + (ulong)uVar5 * 2);
    uVar3 = (ulong)uVar9;
    uVar4 = uVar2 >> 0x18;
    uVar9 = uVar5;
    if (uVar2 < 0x1000000) {
      return (ConsCell *)0x0;
    }
  } while( true );
  while (uVar2 = uVar9, uVar5 < uVar9) {
    uVar7 = uVar4;
    uVar4 = uVar5;
    uVar8 = (ulong)uVar2;
    uVar11 = (ulong)uVar4;
    uVar5 = *(uint *)((long)&pg->cell6 + uVar11 * 2) >> 0x18;
    if (uVar5 <= uVar4) break;
  }
  uVar10 = (ulong)uVar9;
  uVar9 = *(uint *)((long)&pg->cell6 + uVar8 * 2);
  if ((int)uVar3 == 0) {
    *(uint *)&pg->field_0x8 = uVar1 & 0xff00ffff | uVar9 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar3 * 2 + 3) = (char)(uVar9 >> 0x18);
  }
  pCVar12 = (ConsCell *)((long)&pg->cell6 + uVar11 * 2);
  if (uVar7 != 0) {
    *(undefined1 *)((long)&pg->cell6 + (ulong)uVar7 * 2 + 3) = pCVar12->field_0x3;
  }
  lVar6 = (long)(uVar10 * 2 + uVar11 * -2) >> 2;
  *pCVar12 = (ConsCell)((uint)*pCVar12 & 0xfffffff | (int)lVar6 << 0x1c);
  if (7 < lVar6) {
    error("in find_pair_in_page, cdr code too big.");
  }
  uVar4 = uVar4 + ((uint)*pCVar12 >> 0x1c) * 2;
LAB_00114dc6:
  if (0xfe < uVar4) {
    error("in fpip, page overflow.");
  }
  pg->field_0xb = (char)((uint)(byte)pg->field_0xb * 0x1000000 + -0x2000000 >> 0x18);
  *(LispPTR *)((long)&pg->cell6 + uVar10 * 2) = cdrval;
  return pCVar12;
}

Assistant:

static ConsCell *find_pair_in_page(struct conspage *pg, LispPTR cdrval) {
  ConsCell *carcell, *cdrcell;
  unsigned int offset, prior, priorprior, noffset, nprior, poffset;

  if (pg->count < 2) return ((ConsCell *)0);

  priorprior = prior = nprior = 0;

  for (offset = pg->next_cell; offset; offset = FREECONS(pg, offset)->next_free) {
    if (prior) {
      /* if ((6^prior) <= (6^offset)) error("free list in CONS page corrupt."); */
      if ((prior > offset) && (prior <= offset + 14)) {
        poffset = offset;
        noffset = FREECONS(pg, offset)->next_free;
        while ((noffset > offset) && (noffset < prior)) {
          nprior = offset;
          poffset = prior;
          offset = noffset;
          noffset = FREECONS(pg, offset)->next_free;
        }
        carcell = (ConsCell *)((DLword *)pg + offset);
        cdrcell = (ConsCell *)((DLword *)pg + prior);
        if (priorprior)
          FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
        else
          pg->next_cell = FREECONS(pg, poffset)->next_free;
        if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;
        carcell->cdr_code = cdrcell - carcell;
#ifdef NEWCDRCODING
        if ((cdrcell - carcell) > 7) error("in find_pair_in_page, cdr code too big.");
        if (254 < (offset + (carcell->cdr_code << 1))) error("in fpip, page overflow.");
#endif /* NEWCDRCODING */
        pg->count -= 2;
        *((LispPTR *)cdrcell) = cdrval;
        return (carcell);
      } else if ((offset > prior) && (offset <= prior + 14)) {
        carcell = (ConsCell *)((DLword *)pg + prior);
        cdrcell = (ConsCell *)((DLword *)pg + offset);
        if (priorprior)
          FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
        else
          pg->next_cell = ((freecons *)cdrcell)->next_free;
        carcell->cdr_code = cdrcell - carcell;
#ifdef NEWCDRCODING
        if ((cdrcell - carcell) > 7) error("in find_pair_in_page, cdr code too big.");
        if (254 < (prior + (carcell->cdr_code << 1))) error("in fpip, page overflow.");
#endif /* NEWCDRCODING */
        pg->count -= 2;
        *((LispPTR *)cdrcell) = cdrval;
        return (carcell);
      }
    }
    priorprior = prior;
    prior = offset;
  }
  return ((ConsCell *)0);
}